

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O2

void P_InitEffects(void)

{
  uint32 *puVar1;
  DWORD DVar2;
  uint32 uVar3;
  ColorList *pCVar4;
  
  P_InitParticles();
  for (pCVar4 = Colors; DVar2 = gameinfo.defaultbloodparticlecolor, puVar1 = (uint32 *)pCVar4->color
      , puVar1 != (uint32 *)0x0; pCVar4 = pCVar4 + 1) {
    uVar3 = ParticleColor((uint)pCVar4->r,(uint)pCVar4->g,(uint)pCVar4->b);
    *puVar1 = uVar3;
  }
  blood1 = ParticleColor(gameinfo.defaultbloodparticlecolor);
  blood2 = ParticleColor((uint)(byte)(((ushort)(DVar2 >> 0x10) & 0xff) / 3),
                         (uint)(byte)(((ushort)(DVar2 >> 8) & 0xff) / 3),
                         (uint)(byte)(((ushort)DVar2 & 0xff) / 3));
  return;
}

Assistant:

void P_InitEffects ()
{
	const struct ColorList *color = Colors;

	P_InitParticles();
	while (color->color)
	{
		*(color->color) = ParticleColor(color->r, color->g, color->b);
		color++;
	}

	int kind = gameinfo.defaultbloodparticlecolor;
	blood1 = ParticleColor(kind);
	blood2 = ParticleColor(RPART(kind)/3, GPART(kind)/3, BPART(kind)/3);
}